

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void * TableSettingsHandler_ReadOpen(ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  short sVar1;
  char *pcVar2;
  int iVar3;
  ImGuiTableSettings *pIVar4;
  int *piVar5;
  int *piVar6;
  int columns_count;
  ImGuiID id;
  
  pIVar4 = (ImGuiTableSettings *)0x0;
  iVar3 = __isoc99_sscanf(name,"0x%08X,%d");
  if (1 < iVar3) {
    pcVar2 = (GImGui->SettingsTables).Buf.Data;
    if (pcVar2 != (char *)0x0) {
      piVar5 = (int *)(pcVar2 + 4);
      piVar6 = piVar5;
      do {
        if (*piVar6 == 0) {
          sVar1 = *(short *)((long)piVar6 + 0xe);
          iVar3 = (int)sVar1;
          if (-1 < iVar3) {
            piVar6[0] = 0;
            piVar6[1] = 0;
            piVar6[2] = 0;
            piVar6[3] = 0;
            piVar6[4] = 0;
            if (0 < sVar1) {
              piVar5 = piVar6 + 5;
              do {
                piVar5[0] = 0;
                piVar5[1] = 0;
                piVar5[2] = -1;
                *(undefined2 *)(piVar5 + 3) = 0xffff;
                *(byte *)((long)piVar5 + 0xe) = *(byte *)((long)piVar5 + 0xe) & 0xf0 | 4;
                piVar5 = piVar5 + 4;
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
            }
            *piVar6 = 0;
            *(undefined2 *)(piVar6 + 3) = 0;
            *(short *)((long)piVar6 + 0xe) = sVar1;
            *(undefined1 *)(piVar6 + 4) = 1;
            return piVar6;
          }
          *piVar6 = 0;
          break;
        }
        piVar6 = (int *)((long)piVar6 + (long)piVar6[-1]);
      } while (piVar6 != (int *)((long)piVar5 + (long)(GImGui->SettingsTables).Buf.Size));
    }
    pIVar4 = ImGui::TableSettingsCreate(0,0);
  }
  return pIVar4;
}

Assistant:

static void* TableSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiID id = 0;
    int columns_count = 0;
    if (sscanf(name, "0x%08X,%d", &id, &columns_count) < 2)
        return NULL;

    if (ImGuiTableSettings* settings = ImGui::TableSettingsFindByID(id))
    {
        if (settings->ColumnsCountMax >= columns_count)
        {
            TableSettingsInit(settings, id, columns_count, settings->ColumnsCountMax); // Recycle
            return settings;
        }
        settings->ID = 0; // Invalidate storage, we won't fit because of a count change
    }
    return ImGui::TableSettingsCreate(id, columns_count);
}